

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall priorityQueueTest::TearDown(priorityQueueTest *this)

{
  bool bVar1;
  Message *message;
  char *message_00;
  char *in_R9;
  string local_70;
  AssertHelper local_50 [3];
  Message local_38;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  time_t end_time;
  priorityQueueTest *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)time((time_t *)0x0);
  local_29 = (long)gtest_ar_.message_.ptr_ - this->start_time < 0xb;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    message = testing::Message::operator<<(&local_38,(char (*) [24])"The test took too long.");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_28,(AssertionResult *)"end_time-start_time <=10","false",
               "true",in_R9);
    message_00 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0xf,message_00);
    testing::internal::AssertHelper::operator=(local_50,message);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

virtual void TearDown() {
        time_t end_time = time(NULL);
        EXPECT_TRUE(end_time-start_time <=10)<< "The test took too long.";
    }